

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O3

UInt32 Bt2_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  ushort uVar1;
  uint lenLimit;
  ushort *cur;
  UInt32 UVar2;
  UInt32 *pUVar3;
  UInt32 UVar4;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 2) {
    MatchFinder_MovePos(p);
    UVar4 = 0;
  }
  else {
    cur = (ushort *)p->buffer;
    uVar1 = *cur;
    UVar2 = p->hash[uVar1];
    UVar4 = p->pos;
    p->hash[uVar1] = UVar4;
    pUVar3 = GetMatchesSpec1(lenLimit,UVar2,UVar4,(Byte *)cur,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances,1);
    UVar4 = (UInt32)((ulong)((long)pUVar3 - (long)distances) >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar2 = p->pos + 1;
    p->pos = UVar2;
    if (UVar2 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar4;
}

Assistant:

static UInt32 Bt2_MatchFinder_GetMatches(CMatchFinder *p, UInt32 *distances)
{
  UInt32 offset;
  GET_MATCHES_HEADER(2)
  HASH2_CALC;
  curMatch = p->hash[hv];
  p->hash[hv] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 1)
}